

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

void __thiscall JSON::JSON_number::JSON_number(JSON_number *this,longlong value)

{
  longlong value_local;
  JSON_number *this_local;
  
  JSON_value::JSON_value(&this->super_JSON_value,vt_number);
  (this->super_JSON_value)._vptr_JSON_value = (_func_int **)&PTR__JSON_number_00593e90;
  std::__cxx11::to_string(&this->encoded,value);
  return;
}

Assistant:

JSON::JSON_number::JSON_number(long long value) :
    JSON_value(vt_number),
    encoded(std::to_string(value))
{
}